

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O3

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct)

{
  size_t sVar1;
  char buffer [16];
  _Alloc_hider local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  char local_38 [16];
  
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"%","");
  std::__cxx11::string::push_back((char)&local_58);
  if (((int)flag - 0x48U < 0x32) &&
     ((0x2802410022823U >> ((ulong)((int)flag - 0x48U) & 0x3f) & 1) != 0)) {
    sVar1 = strftime(local_38,0x10,local_58._M_p,(tm *)timeStruct);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_38,local_38 + sVar1);
    if ((size_type *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48 + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((size_type *)local_58._M_p == &local_48) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_40;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48;
    }
    __return_storage_ptr__->_M_string_length = local_50;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(
  char flag, struct tm& timeStruct)
{
  std::string formatString = "%";
  formatString += flag;

  switch(flag)
    {
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'w':
    case 'y':
    case 'Y':
      break;
    default:
      {
      return formatString;
      }
    }

  char buffer[16];

  size_t size = strftime(buffer, sizeof(buffer),
    formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}